

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

void __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
::move_from(sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
            *this,MoveDontCopyT mover,
           sparse_hashtable<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
           *ht,size_type min_buckets_wanted)

{
  size_type *psVar1;
  uint *puVar2;
  ushort uVar3;
  undefined4 uVar4;
  pointer psVar5;
  undefined8 uVar6;
  undefined6 uVar7;
  undefined1 auVar8 [12];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  short sVar15;
  float fVar16;
  undefined1 auVar17 [16];
  destructive_iterator it;
  sparse_hashtable_destructive_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
  local_c0;
  destructive_iterator local_78;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 uVar20;
  undefined2 uVar21;
  
  clear(this);
  if (mover == MoveDontGrow) {
    uVar9 = (ht->table).settings.table_size;
  }
  else {
    uVar9 = sparsehash_internal::sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>::
            min_buckets((sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4> *)this,
                        (ht->table).settings.num_buckets - ht->num_deleted,min_buckets_wanted);
  }
  if ((this->table).settings.table_size < uVar9) {
    sparsetable<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::resize(&this->table,uVar9);
    fVar14 = (float)(this->table).settings.table_size;
    fVar16 = (this->settings).
             super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.enlarge_factor_
             * fVar14;
    uVar9 = (ulong)fVar16;
    (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar16 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
    fVar14 = fVar14 * (this->settings).
                      super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
                      shrink_factor_;
    uVar9 = (ulong)fVar14;
    (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar14 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
    (this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>.
    consider_shrink_ = false;
  }
  destructive_begin(&local_78,ht);
  while( true ) {
    local_c0.pos.row_begin._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c0.pos.row_end._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c0.pos.col_current = (const_reference)0x0;
    local_c0.end.col_current = (nonempty_iterator)0x0;
    local_c0.ht = ht;
    local_c0.pos.row_current._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_begin._M_current = local_c0.pos.row_begin._M_current;
    local_c0.end.row_end._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_current._M_current = local_c0.pos.row_end._M_current;
    sparse_hashtable_destructive_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::advance_past_deleted(&local_c0);
    if ((((local_78.pos.row_begin._M_current == local_c0.pos.row_begin._M_current) &&
         (local_78.pos.row_end._M_current == local_c0.pos.row_end._M_current)) &&
        (local_78.pos.row_current._M_current == local_c0.pos.row_current._M_current)) &&
       ((local_78.pos.row_current._M_current == local_78.pos.row_end._M_current ||
        (local_78.pos.col_current == local_c0.pos.col_current)))) break;
    g_num_hashes = g_num_hashes + 1;
    uVar4 = *(undefined4 *)((local_78.pos.col_current)->first).buffer_;
    uVar20 = (undefined1)((uint)uVar4 >> 0x18);
    uVar21 = CONCAT11(uVar20,uVar20);
    uVar20 = (undefined1)((uint)uVar4 >> 0x10);
    uVar6 = CONCAT35(CONCAT21(uVar21,uVar20),CONCAT14(uVar20,uVar4));
    uVar20 = (undefined1)((uint)uVar4 >> 8);
    uVar7 = CONCAT51(CONCAT41((int)((ulong)uVar6 >> 0x20),uVar20),uVar20);
    sVar15 = CONCAT11((char)uVar4,(char)uVar4);
    uVar9 = CONCAT62(uVar7,sVar15);
    auVar19._8_4_ = 0;
    auVar19._0_8_ = uVar9;
    auVar19._12_2_ = uVar21;
    auVar19._14_2_ = uVar21;
    uVar21 = (undefined2)((ulong)uVar6 >> 0x20);
    auVar18._12_4_ = auVar19._12_4_;
    auVar18._8_2_ = 0;
    auVar18._0_8_ = uVar9;
    auVar18._10_2_ = uVar21;
    auVar17._10_6_ = auVar18._10_6_;
    auVar17._8_2_ = uVar21;
    auVar17._0_8_ = uVar9;
    uVar21 = (undefined2)uVar7;
    auVar8._4_8_ = auVar17._8_8_;
    auVar8._2_2_ = uVar21;
    auVar8._0_2_ = uVar21;
    psVar5 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = (this->table).settings.table_size - 1;
    uVar11 = (long)((auVar18._12_4_ >> 0x18) + (auVar8._0_4_ >> 0x18) +
                   (auVar17._8_4_ >> 0x18) +
                   ((int)sVar15 >> 8) + ((local_78.pos.col_current)->first).i_) & uVar12;
    uVar10 = uVar11 / 0x30;
    uVar9 = uVar11 % 0x30;
    if ((psVar5[uVar10].bitmap[uVar9 >> 3] >> ((uint)uVar9 & 7) & 1) != 0) {
      lVar13 = 1;
      do {
        uVar11 = uVar11 + lVar13 & uVar12;
        uVar10 = uVar11 / 0x30;
        uVar9 = uVar11 % 0x30;
        lVar13 = lVar13 + 1;
      } while ((psVar5[uVar10].bitmap[uVar9 >> 3] >> ((uint)uVar9 & 7) & 1) != 0);
    }
    uVar3 = psVar5[uVar10].settings.num_buckets;
    sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::set(psVar5 + uVar10,(size_type_conflict)uVar9,local_78.pos.col_current);
    psVar1 = &(this->table).settings.num_buckets;
    *psVar1 = *psVar1 + ((ulong)(this->table).groups.
                                super__Vector_base<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10].settings.
                                num_buckets - (ulong)uVar3);
    local_78.pos.col_current = local_78.pos.col_current + 1;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<8,_8>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>_>_>_>
    ::advance_past_end(&local_78.pos);
    sparse_hashtable_destructive_iterator<std::pair<const_HashObject<8,_8>,_int>,_HashObject<8,_8>,_HashFn,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<8,_8>,_int,_HashFn,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>::SetKey,_std::equal_to<HashObject<8,_8>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<8,_8>,_int>_>_>
    ::advance_past_deleted(&local_78);
  }
  puVar2 = &(this->settings).super_sh_hashtable_settings<HashObject<8,_8>,_HashFn,_unsigned_long,_4>
            .num_ht_copies_;
  *puVar2 = *puVar2 + 1;
  return;
}

Assistant:

void move_from(MoveDontCopyT mover, sparse_hashtable& ht,
                 size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    size_type resize_to;
    if (mover == MoveDontGrow)
      resize_to = ht.bucket_count();  // keep same size as old ht
    else                              // MoveDontCopy
      resize_to = settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    // THIS IS THE MAJOR LINE THAT DIFFERS FROM COPY_FROM():
    for (destructive_iterator it = ht.destructive_begin();
         it != ht.destructive_end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      for (bucknum = hash(get_key(*it)) & (bucket_count() - 1);  // h % buck_cnt
           table.test(bucknum);                                  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & (bucket_count() - 1)) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }